

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void deltest(void *elem)

{
  bool bVar1;
  int iVar2;
  int local_14;
  int i;
  void *elem_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = false;
    if (local_14 < arraylen) {
      iVar2 = (*cmp)(elem,array[local_14]);
      bVar1 = 0 < iVar2;
    }
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  if ((local_14 < arraylen) && (iVar2 = (*cmp)(elem,array[local_14]), iVar2 == 0)) {
    delpostest(local_14);
  }
  return;
}

Assistant:

void deltest(void *elem)
{
    int i;

    i = 0;
    while (i < arraylen && cmp(elem, array[i]) > 0)
        i++;
    if (i >= arraylen || cmp(elem, array[i]) != 0)
        return;                        /* don't do it! */
    delpostest(i);
}